

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_de8362::WorkflowStepTypeHelper(Type *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String local_b8;
  String local_98;
  String local_78;
  String local_48;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  Type *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    cmCMakePresetsErrors::INVALID_PRESET((Value *)0x0,state);
    out_local._7_1_ = false;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_48,(Value *)state_local);
      bVar1 = std::operator==(&local_48,"configure");
      std::__cxx11::string::~string((string *)&local_48);
      if (bVar1) {
        *(undefined4 *)&value_local->value_ = 0;
        out_local._7_1_ = true;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_78,(Value *)state_local);
        bVar1 = std::operator==(&local_78,"build");
        std::__cxx11::string::~string((string *)&local_78);
        if (bVar1) {
          *(undefined4 *)&value_local->value_ = 1;
          out_local._7_1_ = true;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_98,(Value *)state_local);
          bVar1 = std::operator==(&local_98,"test");
          std::__cxx11::string::~string((string *)&local_98);
          if (bVar1) {
            *(undefined4 *)&value_local->value_ = 2;
            out_local._7_1_ = true;
          }
          else {
            Json::Value::asString_abi_cxx11_(&local_b8,(Value *)state_local);
            bVar1 = std::operator==(&local_b8,"package");
            std::__cxx11::string::~string((string *)&local_b8);
            if (bVar1) {
              *(undefined4 *)&value_local->value_ = 3;
              out_local._7_1_ = true;
            }
            else {
              cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
              out_local._7_1_ = false;
            }
          }
        }
      }
    }
    else {
      out_local._7_1_ = false;
    }
  }
  return out_local._7_1_;
}

Assistant:

bool WorkflowStepTypeHelper(WorkflowPreset::WorkflowStep::Type& out,
                            const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (!value->isString()) {
    return false;
  }

  if (value->asString() == "configure") {
    out = WorkflowPreset::WorkflowStep::Type::Configure;
    return true;
  }

  if (value->asString() == "build") {
    out = WorkflowPreset::WorkflowStep::Type::Build;
    return true;
  }

  if (value->asString() == "test") {
    out = WorkflowPreset::WorkflowStep::Type::Test;
    return true;
  }

  if (value->asString() == "package") {
    out = WorkflowPreset::WorkflowStep::Type::Package;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}